

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::ReadCmdFromProcessPipe
          (CPalSynchronizationManager *this,int iPollTimeout,SynchWorkerCmd *pswcWorkerCmd,
          SHMPTR *pshridMarshaledData,DWORD *pdwData)

{
  SynchWorkerCmd SVar1;
  int iVar2;
  int *piVar3;
  PAL_ERROR PVar4;
  SHMPTR local_48;
  SHMPTR shridMarshaledId;
  undefined4 local_38;
  byte local_31;
  DWORD dwData;
  BYTE byVal;
  
  shridMarshaledId = (SHMPTR)pdwData;
  if (pswcWorkerCmd == (SynchWorkerCmd *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e3);
    fprintf(_stderr,"Expression: NULL != pswcWorkerCmd\n");
  }
  if (pshridMarshaledData == (SHMPTR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e4);
    fprintf(_stderr,"Expression: NULL != pshridMarshaledData\n");
  }
  if (shridMarshaledId == 0) {
    fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x6e5);
    fprintf(_stderr,"Expression: NULL != pdwData\n");
  }
  SVar1 = ReadBytesFromProcessPipe(this,iPollTimeout,&local_31,1);
  if ((int)SVar1 < 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
    piVar3 = __errno_location();
    strerror(*piVar3);
    SVar1 = SynchWorkerCmdNop;
    PVar4 = 0x54f;
  }
  else {
    if (SVar1 != SynchWorkerCmdNop) {
      if (SVar1 != SynchWorkerCmdRemoteSignal) {
        fprintf(_stderr,"] %s %s:%d","ReadCmdFromProcessPipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x6f5);
        fprintf(_stderr,
                "Expression: sizeof(BYTE) == iRet, Description: Got %d bytes from process pipe while expecting for %d\n"
                ,(ulong)SVar1,1);
      }
      SVar1 = (SynchWorkerCmd)local_31;
      if (SynchWorkerCmdShutdown < SVar1) {
        PVar4 = 0x54f;
        if (PAL_InitializeChakraCoreCalled != false) goto LAB_001da81b;
        goto LAB_001da833;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
    }
    PVar4 = 0;
    if (SVar1 - SynchWorkerCmdRemoteSignal < 2) {
      local_48 = 0;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
      iVar2 = ReadBytesFromProcessPipe(this,0xfa,(BYTE *)&local_48,8);
      if (iVar2 == 8) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
        *pshridMarshaledData = local_48;
        PVar4 = 0;
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
        piVar3 = __errno_location();
        strerror(*piVar3);
        PVar4 = 0x54f;
      }
      if (iVar2 != 8) goto LAB_001da81b;
    }
    if (SVar1 == SynchWorkerCmdDelegatedObjectSignaling) {
      iVar2 = ReadBytesFromProcessPipe(this,0xfa,(BYTE *)&local_38,4);
      if (iVar2 == 4) {
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_001da833:
          abort();
        }
        *(undefined4 *)shridMarshaledId = local_38;
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001da833;
        piVar3 = __errno_location();
        strerror(*piVar3);
        PVar4 = 0x54f;
      }
      SVar1 = SynchWorkerCmdDelegatedObjectSignaling;
    }
  }
LAB_001da81b:
  if (PVar4 == 0) {
    *pswcWorkerCmd = SVar1;
  }
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::ReadCmdFromProcessPipe(
        int iPollTimeout,
        SynchWorkerCmd * pswcWorkerCmd,
        SharedID * pshridMarshaledData,
        DWORD * pdwData)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet;
        BYTE byVal;
        SynchWorkerCmd swcWorkerCmd = SynchWorkerCmdNop;

        _ASSERTE(NULL != pswcWorkerCmd);
        _ASSERTE(NULL != pshridMarshaledData);
        _ASSERTE(NULL != pdwData);

        iRet = ReadBytesFromProcessPipe(iPollTimeout, &byVal, sizeof(BYTE));

        if (0 > iRet)
        {
            ERROR("Failed polling the process pipe [ret=%d errno=%d (%s)]\n",
                  iRet, errno, strerror(errno));
            palErr = ERROR_INTERNAL_ERROR;
            goto RCFPP_exit;
        }

        if (iRet != 0)
        {
            _ASSERT_MSG(sizeof(BYTE) == iRet,
                        "Got %d bytes from process pipe while expecting for %d\n",
                        iRet, sizeof(BYTE));

            swcWorkerCmd = (SynchWorkerCmd)byVal;

            if(SynchWorkerCmdLast <= swcWorkerCmd)
            {
                ERROR("Got unknown worker command code %d from the process "
                       "pipe!\n", swcWorkerCmd);
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            _ASSERT_MSG(SynchWorkerCmdNop == swcWorkerCmd ||
                        SynchWorkerCmdRemoteSignal == swcWorkerCmd ||
                        SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd ||
                        SynchWorkerCmdShutdown == swcWorkerCmd,
                        "Unknown WrkrCmd=%u\n", swcWorkerCmd);

            TRACE("Got cmd %u from process pipe\n", swcWorkerCmd);
        }

        if (SynchWorkerCmdRemoteSignal == swcWorkerCmd ||
            SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd)
        {
            SharedID shridMarshaledId = NULLSharedID;

            TRACE("Received %s cmd\n",
                  (swcWorkerCmd == SynchWorkerCmdRemoteSignal) ?
                  "REMOTE SIGNAL" : "DELEGATED OBJECT SIGNALING" );

            iRet = ReadBytesFromProcessPipe(WorkerCmdCompletionTimeout,
                                            (BYTE *)&shridMarshaledId,
                                            sizeof(shridMarshaledId));
            if (sizeof(shridMarshaledId) != iRet)
            {
                ERROR("Unable to read marshaled Shared ID from the "
                      "process pipe [pipe=%d ret=%d errno=%d (%s)]\n",
                      m_iProcessPipeRead, iRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            TRACE("Received marshaled shrid=%p\n", (VOID *)shridMarshaledId);

            *pshridMarshaledData = shridMarshaledId;
        }

        if (SynchWorkerCmdDelegatedObjectSignaling == swcWorkerCmd)
        {
            DWORD dwData;

            iRet = ReadBytesFromProcessPipe(WorkerCmdCompletionTimeout,
                                            (BYTE *)&dwData,
                                            sizeof(dwData));
            if (sizeof(dwData) != iRet)
            {
                ERROR("Unable to read signal count from the "
                      "process pipe [pipe=%d ret=%d errno=%d (%s)]\n",
                      m_iProcessPipeRead, iRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                goto RCFPP_exit;
            }

            TRACE("Received signal count %u\n", dwData);

            *pdwData = dwData;
        }

    RCFPP_exit:
        if (NO_ERROR == palErr)
        {
            *pswcWorkerCmd = swcWorkerCmd;
        }
        return palErr;
    }